

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::makeBool(JSON *this,bool value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  unique_ptr<JSON::JSON_bool,_std::default_delete<JSON::JSON_bool>_> local_28;
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> local_20;
  undefined1 local_11;
  JSON *pJStack_10;
  bool value_local;
  
  local_11 = value;
  pJStack_10 = this;
  std::make_unique<JSON::JSON_bool,bool&>((bool *)&local_28);
  std::unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>>::
  unique_ptr<JSON::JSON_bool,std::default_delete<JSON::JSON_bool>,void>
            ((unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>> *)&local_20,
             &local_28);
  JSON(this,&local_20);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::~unique_ptr(&local_20);
  std::unique_ptr<JSON::JSON_bool,_std::default_delete<JSON::JSON_bool>_>::~unique_ptr(&local_28);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeBool(bool value)
{
    return {std::make_unique<JSON_bool>(value)};
}